

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void free_old_nodes(Parser *p)

{
  PNode *pPVar1;
  SNode *pSVar2;
  PNode *pPVar3;
  uint32 uVar4;
  SNode **local_48;
  SNode **lsn;
  SNode *tsn;
  SNode *sn;
  PNode **lpn;
  PNode *tpn;
  PNode *pn;
  uint h;
  uint i;
  Parser *p_local;
  
  pPVar1 = (p->pnode_hash).all;
  tsn = (p->snode_hash).all;
  while (tsn != (SNode *)0x0) {
    pSVar2 = tsn->all_next;
    for (local_48 = (p->snode_hash).v +
                    (ulong)(uint)((int)(((long)tsn->state - (long)p->t->state) / 0x78 << 0xc) +
                                 (int)tsn->initial_scope) % (ulong)(p->snode_hash).m;
        *local_48 != tsn; local_48 = &(*local_48)->bucket_next) {
    }
    *local_48 = (*local_48)->bucket_next;
    tsn = pSVar2;
  }
  pSVar2 = (p->snode_hash).last_all;
  (p->snode_hash).last_all = (SNode *)0x0;
  while (tsn = pSVar2, tsn != (SNode *)0x0) {
    pSVar2 = tsn->all_next;
    uVar4 = tsn->refcount - 1;
    tsn->refcount = uVar4;
    if (uVar4 == 0) {
      free_SNode(p,tsn);
    }
  }
  (p->snode_hash).last_all = (p->snode_hash).all;
  (p->snode_hash).all = (SNode *)0x0;
  while (tpn = pPVar1, tpn != (PNode *)0x0) {
    for (pn._4_4_ = 0; pn._4_4_ < (tpn->children).n; pn._4_4_ = pn._4_4_ + 1) {
      while ((tpn->children).v[pn._4_4_] != (tpn->children).v[pn._4_4_]->latest) {
        pPVar1 = (tpn->children).v[pn._4_4_]->latest;
        pPVar1->refcount = pPVar1->refcount + 1;
        pPVar3 = (tpn->children).v[pn._4_4_];
        uVar4 = pPVar3->refcount - 1;
        pPVar3->refcount = uVar4;
        if (uVar4 == 0) {
          free_PNode(p,(tpn->children).v[pn._4_4_]);
        }
        (tpn->children).v[pn._4_4_] = pPVar1;
      }
    }
    pPVar1 = tpn->all_next;
    for (sn = (SNode *)((p->pnode_hash).v +
                       (ulong)(uint)((int)((long)(tpn->parse_node).start_loc.s << 8) +
                                     (int)((long)(tpn->parse_node).end_skip << 0x10) +
                                     (tpn->parse_node).symbol + (int)tpn->initial_scope) %
                       (ulong)(p->pnode_hash).m); (PNode *)(sn->loc).s != tpn;
        sn = (SNode *)((sn->loc).s + 0x60)) {
    }
    (sn->loc).s = *(char **)((sn->loc).s + 0x60);
    uVar4 = tpn->refcount - 1;
    tpn->refcount = uVar4;
    if (uVar4 == 0) {
      free_PNode(p,tpn);
    }
  }
  (p->pnode_hash).n = 0;
  (p->pnode_hash).all = (PNode *)0x0;
  return;
}

Assistant:

static void free_old_nodes(Parser *p) {
  uint i, h;
  PNode *pn = p->pnode_hash.all, *tpn, **lpn;
  SNode *sn = p->snode_hash.all, *tsn, **lsn;
  while (sn) {
    h = SNODE_HASH(sn->state - p->t->state, sn->initial_scope);
    lsn = &p->snode_hash.v[h % p->snode_hash.m];
    tsn = sn;
    sn = sn->all_next;
    while (*lsn != tsn) lsn = &(*lsn)->bucket_next;
    *lsn = (*lsn)->bucket_next;
  }
  sn = p->snode_hash.last_all;
  p->snode_hash.last_all = 0;
  while (sn) {
    tsn = sn;
    sn = sn->all_next;
    unref_sn(p, tsn);
  }
  p->snode_hash.last_all = p->snode_hash.all;
  p->snode_hash.all = NULL;
  while (pn) {
    for (i = 0; i < pn->children.n; i++) {
      while (pn->children.v[i] != pn->children.v[i]->latest) {
        tpn = pn->children.v[i]->latest;
        ref_pn(tpn);
        unref_pn(p, pn->children.v[i]);
        pn->children.v[i] = tpn;
      }
    }
    h = PNODE_HASH(pn->parse_node.start_loc.s, pn->parse_node.end_skip, pn->parse_node.symbol, pn->initial_scope);
    lpn = &p->pnode_hash.v[h % p->pnode_hash.m];
    tpn = pn;
    pn = pn->all_next;
    while (*lpn != tpn) lpn = &(*lpn)->bucket_next;
    *lpn = (*lpn)->bucket_next;
    unref_pn(p, tpn);
  }
  p->pnode_hash.n = 0;
  p->pnode_hash.all = NULL;
}